

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O1

JSON __thiscall JSON::makeReal(JSON *this,double value)

{
  _Head_base<0UL,_JSON::JSON_value_*,_false> _Var1;
  Members *__p;
  undefined1 in_CL;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  JSON JVar2;
  
  _Var1._M_head_impl = (JSON_value *)operator_new(0x30);
  (_Var1._M_head_impl)->type_code = vt_number;
  (_Var1._M_head_impl)->_vptr_JSON_value = (_func_int **)&PTR__JSON_number_002eee48;
  QUtil::double_to_string_abi_cxx11_
            ((string *)(_Var1._M_head_impl + 1),(QUtil *)0x6,value,1,(bool)in_CL);
  __p = (Members *)operator_new(0x18);
  (__p->value)._M_t.super___uniq_ptr_impl<JSON::JSON_value,_std::default_delete<JSON::JSON_value>_>.
  _M_t.super__Tuple_impl<0UL,_JSON::JSON_value_*,_std::default_delete<JSON::JSON_value>_>.
  super__Head_base<0UL,_JSON::JSON_value_*,_false>._M_head_impl = _Var1._M_head_impl;
  __p->start = 0;
  __p->end = 0;
  (this->m).super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr = __p;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<JSON::Members*>
            (&(this->m).super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             __p);
  JVar2.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  JVar2.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (JSON)JVar2.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

JSON
JSON::makeReal(double value)
{
    return {std::make_unique<JSON_number>(value)};
}